

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void haddpd_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
      UVar1 = (pMyDisasm->Reserved_).VEX.pp;
      if (UVar1 == '\x03') {
        uVar2 = 0x73706464616876;
LAB_00122239:
        *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar2;
        ArgsVEX(pMyDisasm);
        return;
      }
      if (UVar1 == '\x01') {
        uVar2 = 0x64706464616876;
        goto LAB_00122239;
      }
    }
LAB_001221e4:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x6001d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"haddpd",7);
    }
    else {
      if ((pMyDisasm->Reserved_).PrefRepne != 1) goto LAB_001221e4;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x6001d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"haddps",7);
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    (pMyDisasm->Operand1).AccessMode = 3;
  }
  return;
}

Assistant:

void __bea_callspec__ haddpd_VW(PDISASM pMyDisasm)
{

 if (GV.VEX.state == InUsePrefix) {
   if (GV.EVEX.state == InUsePrefix) {
     failDecode(pMyDisasm);
   }
   else {
     if (GV.VEX.pp == 0x1) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vhaddpd");
       #endif
       ArgsVEX(pMyDisasm);
     }
     else if (GV.VEX.pp == 0x3){
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vhaddps");
       #endif
       ArgsVEX(pMyDisasm);
     }
     else {
       failDecode(pMyDisasm);
     }
   }

 }
 else {
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128_xmm;
       pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+SIMD_FP_HORIZONTAL;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "haddpd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else if (GV.PrefRepne == 1){
      /* 0xF2 */
       GV.MemDecoration = Arg2_m128_xmm;
       pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+SIMD_FP_HORIZONTAL;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "haddps");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else {
     failDecode(pMyDisasm);
   }
 }

}